

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O0

char * vk::wsi::getExtensionName(Type wsiType)

{
  char **ppcVar1;
  Type wsiType_local;
  
  ppcVar1 = de::getSizedArrayElement<6,6,char_const*>(&getExtensionName::s_extNames,wsiType);
  return *ppcVar1;
}

Assistant:

const char* getExtensionName (Type wsiType)
{
	static const char* const s_extNames[] =
	{
		"VK_KHR_xlib_surface",
		"VK_KHR_xcb_surface",
		"VK_KHR_wayland_surface",
		"VK_KHR_mir_surface",
		"VK_KHR_android_surface",
		"VK_KHR_win32_surface",
	};
	return de::getSizedArrayElement<TYPE_LAST>(s_extNames, wsiType);
}